

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O0

void __thiscall CircBufTest::thread2main(CircBufTest *this)

{
  int iVar1;
  int local_128;
  int i;
  int offset;
  uchar local_118 [8];
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  CircBufTest *this_local;
  
  offset = -1;
  std::fill<unsigned_char*,int>(dumpBuf + 0x78,buf + 0x78,&offset);
  i = 10;
  std::fill<unsigned_char*,int>(local_118,dumpBuf + 0x78,&i);
  JetHead::CircularBuffer::Lock(&this->gbuff);
  iVar1 = JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::write((uchar *)&this->gbuff,(int)dumpBuf + 0x78);
  JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::copy((uchar *)&this->gbuff,(int)local_118);
  for (local_128 = iVar1; local_128 < iVar1 + 0x40; local_128 = local_128 + 1) {
    if (dumpBuf[(long)(local_128 - iVar1) + 0x78] != local_118[local_128]) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                 ,0x350,"Lock doesn\'t work.");
    }
  }
  JetHead::CircularBuffer::Unlock(&this->gbuff);
  iVar1 = JetHead::CircularBuffer::waitForFreeSpace((int)this + 0x128,0x80);
  if (iVar1 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x357,"waitForFreeSpace might be broken.");
  }
  return;
}

Assistant:

void CircBufTest::thread2main()
{

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];

	fill(buf, buf + BUFFER_SIZE, -1);
	fill(dumpBuf, dumpBuf + BUFFER_SIZE, 10);

	gbuff.Lock();
	int offset = gbuff.getLength();

	gbuff.write(buf, BUFFER_SIZE / 2);

	gbuff.copy(dumpBuf, gbuff.getLength());

	for( int i = 0 + offset; i < offset + (BUFFER_SIZE / 2); ++i)
		if( buf[i - offset] != dumpBuf[i] )
			TestFailed("Lock doesn't work.");


	gbuff.Unlock();

	// Wait till the other guy clears the buffer.
	if(!gbuff.waitForFreeSpace(BUFFER_SIZE, 1000))
		TestFailed("waitForFreeSpace might be broken.");


}